

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_pool.h
# Opt level: O3

void __thiscall
VW::object_pool<example,_example_initializer>::return_object
          (object_pool<example,_example_initializer> *this,example *obj)

{
  iterator *piVar1;
  _Elt_pointer ppeVar2;
  unique_lock<std::mutex> lock;
  example *local_30;
  unique_lock<std::mutex> local_28;
  
  local_28._M_owns = false;
  local_30 = obj;
  local_28._M_device = &this->m_lock;
  std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  ppeVar2 = (this->m_pool).c.super__Deque_base<example_*,_std::allocator<example_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  if (ppeVar2 ==
      (this->m_pool).c.super__Deque_base<example_*,_std::allocator<example_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<example*,std::allocator<example*>>::_M_push_back_aux<example*const&>
              ((deque<example*,std::allocator<example*>> *)&this->m_pool,&local_30);
  }
  else {
    *ppeVar2 = obj;
    piVar1 = &(this->m_pool).c.super__Deque_base<example_*,_std::allocator<example_*>_>._M_impl.
              super__Deque_impl_data._M_finish;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  return;
}

Assistant:

void return_object(T* obj)
  {
    std::unique_lock<std::mutex> lock(m_lock);
    assert(is_from_pool(obj));
    m_pool.push(obj);
  }